

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

double __thiscall despot::Logger::AverageUndiscountedRoundReward(Logger *this)

{
  size_type sVar1;
  const_reference pvVar2;
  undefined1 auVar3 [16];
  double local_40;
  double reward;
  double dStack_18;
  int i;
  double sum;
  Logger *this_local;
  
  dStack_18 = 0.0;
  reward._4_4_ = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(&this->undiscounted_round_rewards_);
    if (sVar1 <= (ulong)(long)reward._4_4_) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->undiscounted_round_rewards_,(long)reward._4_4_);
    dStack_18 = *pvVar2 + dStack_18;
    reward._4_4_ = reward._4_4_ + 1;
  }
  sVar1 = std::vector<double,_std::allocator<double>_>::size(&this->undiscounted_round_rewards_);
  if (sVar1 == 0) {
    local_40 = 0.0;
  }
  else {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(&this->undiscounted_round_rewards_);
    auVar3._8_4_ = (int)(sVar1 >> 0x20);
    auVar3._0_8_ = sVar1;
    auVar3._12_4_ = 0x45300000;
    local_40 = dStack_18 /
               ((auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  }
  return local_40;
}

Assistant:

double Logger::AverageUndiscountedRoundReward() const {
	double sum = 0;
	for (int i = 0; i < undiscounted_round_rewards_.size(); i++) {
		double reward = undiscounted_round_rewards_[i];
		sum += reward;
	}
	return undiscounted_round_rewards_.size() > 0 ?
			(sum / undiscounted_round_rewards_.size()) : 0.0;
}